

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitFactoredDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitFactoredDecPOMDPDiscrete::SetProblem
          (PlanningUnitFactoredDecPOMDPDiscrete *this,FactoredDecPOMDPDiscreteInterface *p)

{
  if (this->_m_fDecPOMDP == p) {
    return;
  }
  this->_m_fDecPOMDP = p;
  if (p != (FactoredDecPOMDPDiscreteInterface *)0x0) {
    PlanningUnitDecPOMDPDiscrete::SetProblem
              (&this->super_PlanningUnitDecPOMDPDiscrete,
               (DecPOMDPDiscreteInterface *)(&p->field_0x0 + *(long *)(*(long *)p + -0xf0)));
    return;
  }
  PlanningUnitDecPOMDPDiscrete::SetProblem
            (&this->super_PlanningUnitDecPOMDPDiscrete,(DecPOMDPDiscreteInterface *)0x0);
  return;
}

Assistant:

void PlanningUnitFactoredDecPOMDPDiscrete::SetProblem(FactoredDecPOMDPDiscreteInterface* p)
{
    if(p == GetFDPOMDPD())
        return;

    _m_fDecPOMDP = p;
    //set (and initialize) the problem at PlanningUnitDecPOMDPDiscrete level:
    DecPOMDPDiscreteInterface* p2 = static_cast<DecPOMDPDiscreteInterface*>(p);
    PlanningUnitDecPOMDPDiscrete::SetProblem(p2);
}